

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_SclPerformBuffering_rec(Abc_Obj_t *pObj,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pObj_01;
  long lVar4;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar2 = *(uint *)&pObj->field_0x14;
    *(uint *)&pObj->field_0x14 = uVar2 & 0xfff;
    uVar2 = uVar2 & 0xf;
    if (uVar2 - 5 < 0xfffffffe) {
      if ((7 < uVar2) || ((0xa4U >> uVar2 & 1) == 0)) {
        __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x1af,"void Abc_SclPerformBuffering_rec(Abc_Obj_t *, int, int, int, int)");
      }
      for (lVar4 = 0; iVar1 = (pObj->vFanouts).nSize, iVar3 = iVar1, lVar4 < iVar1;
          lVar4 = lVar4 + 1) {
        Abc_SclPerformBuffering_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],DegreeR,
                   Degree,fUseInvs,fVerbose);
      }
      while (Degree < iVar3) {
        Abc_SclPerformBufferingOne(pObj,Degree,fUseInvs,fVerbose);
        iVar3 = (pObj->vFanouts).nSize;
      }
      if (DegreeR < iVar1 && DegreeR != 0) {
        if (fUseInvs == 0) {
          pObj_00 = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        else {
          pObj_00 = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        vNodes = Vec_PtrAlloc((pObj->vFanouts).nSize);
        Abc_NodeCollectFanouts(pObj,vNodes);
        for (iVar1 = 0; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
          pObj_01 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar1);
          Abc_ObjPatchFanin(pObj_01,pObj,pObj_00);
        }
        Vec_PtrFree(vNodes);
        Abc_ObjAddFanin(pObj_00,pObj);
        iVar1 = Abc_SclComputeReverseLevel(pObj_00);
        *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xfff | iVar1 << 0xc;
        if (fUseInvs != 0) {
          Abc_NodeInvUpdateFanPolarity(pObj_00);
        }
      }
      iVar1 = Abc_SclComputeReverseLevel(pObj);
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar1 << 0xc;
    }
  }
  return;
}

Assistant:

void Abc_SclPerformBuffering_rec( Abc_Obj_t * pObj, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer;
    Abc_Obj_t * pFanout;
    int i, nOldFanNum;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->Level = 0;
    if ( Abc_ObjIsCo(pObj) )
        return;
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // buffer fanouts and collect reverse levels
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_SclPerformBuffering_rec( pFanout, DegreeR, Degree, fUseInvs, fVerbose );
    // perform buffering as long as needed
    nOldFanNum = Abc_ObjFanoutNum(pObj);
    while ( Abc_ObjFanoutNum(pObj) > Degree )
        Abc_SclPerformBufferingOne( pObj, Degree, fUseInvs, fVerbose );
    // add yet another level of buffers
    if ( DegreeR && nOldFanNum > DegreeR )
    {
        if ( fUseInvs )
            pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
        else
            pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
        vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
        Abc_NodeCollectFanouts( pObj, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        Vec_PtrFree( vFanouts );
        Abc_ObjAddFanin( pBuffer, pObj );
        pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
        if ( fUseInvs )
            Abc_NodeInvUpdateFanPolarity( pBuffer );
    }
    // compute the new level of the node
    pObj->Level = Abc_SclComputeReverseLevel( pObj );
}